

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.cpp
# Opt level: O0

void __thiscall
Memory::RecyclerSweep::
MergePendingNewHeapBlockList<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this)

{
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list_00;
  Data<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *pDVar1;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> **blockList;
  RecyclerSweep *this_local;
  
  pDVar1 = GetData<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>(this);
  list_00 = pDVar1->pendingMergeNewHeapBlockList;
  pDVar1->pendingMergeNewHeapBlockList =
       (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
  HeapBlockList::
  ForEachEditing<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::RecyclerSweep::MergePendingNewHeapBlockList<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>()::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (list_00,(anon_class_8_1_8991fb9c)this);
  return;
}

Assistant:

void
RecyclerSweep::MergePendingNewHeapBlockList()
{
    TBlockType *& blockList = this->GetData<TBlockType>().pendingMergeNewHeapBlockList;
    TBlockType * list = blockList;
    blockList = nullptr;
    HeapBlockList::ForEachEditing(list, [this](TBlockType * heapBlock)
    {
        auto& bucket = this->heapInfo->GetBucket<TBlockType::RequiredAttributes>(heapBlock->GetObjectSize());
        bucket.MergeNewHeapBlock(heapBlock);
    });
}